

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_shape_breath_code(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *pcVar3;
  
  pvVar2 = parser_priv(p);
  pcVar3 = parser_getstr(p,"code");
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar3 = string_make(pcVar3);
    *(char **)((long)pvVar2 + 0x80) = pcVar3;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_shape_breath_code(struct parser *p) {
	struct player_shape *shape = parser_priv(p);
	const char *code = parser_getstr(p, "code");

	if (!shape)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	shape->breath_name = string_make(code);
	return PARSE_ERROR_NONE;
}